

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

bool __thiscall
sqlite_orm::internal::storage_impl_base::table_exists
          (storage_impl_base *this,string *tableName,sqlite3 *db)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  system_error *this_00;
  error_category *peVar5;
  char *__what;
  error_code __ec;
  bool result;
  __string_type query;
  stringstream ss;
  undefined1 local_1c9;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  local_1c9 = 0;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"SELECT COUNT(*) FROM sqlite_master WHERE type = \'",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"table",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\' AND name = \'",0xe);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(tableName->_M_dataplus)._M_p,tableName->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
  std::__cxx11::stringbuf::str();
  iVar2 = sqlite3_exec(db,local_1c8,table_exists::anon_class_1_0_00000001::__invoke,&local_1c9,0);
  uVar1 = local_1c9;
  if (iVar2 == 0) {
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return (bool)uVar1;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  uVar3 = sqlite3_errcode(db);
  peVar5 = &get_sqlite_error_category()->super_error_category;
  __what = (char *)sqlite3_errmsg(db);
  __ec._4_4_ = 0;
  __ec._M_value = uVar3;
  __ec._M_cat = peVar5;
  std::system_error::system_error(this_00,__ec,__what);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

bool table_exists(const std::string &tableName, sqlite3 *db) const {
        auto result = false;
        std::stringstream ss;
        ss << "SELECT COUNT(*) FROM sqlite_master WHERE type = '"
           << "table"
           << "' AND name = '" << tableName << "'";
        auto query = ss.str();
        auto rc = sqlite3_exec(
            db,
            query.c_str(),
            [](void *data, int argc, char **argv, char * * /*azColName*/) -> int {
              auto &res = *(bool *)data;
              if(argc) {
                  res = !!std::atoi(argv[0]);
              }
              return 0;
            },
            &result,
            nullptr);
        if(rc != SQLITE_OK) {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
        return result;
    }